

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall
CVmRun::compute_sum_lcl_imm(CVmRun *this,vm_val_t *lclp,vm_val_t *ival,int lclidx,uchar *p)

{
  anon_union_8_8_cb74652f_for_val aVar1;
  undefined4 uVar2;
  vm_val_t *pvVar3;
  int iVar4;
  
  iVar4 = compute_sum(this,lclp,ival);
  pvVar3 = sp_;
  if (iVar4 == 0) {
    uVar2 = *(undefined4 *)&ival->field_0x4;
    aVar1 = ival->val;
    sp_ = sp_ + 1;
    pvVar3->typ = ival->typ;
    *(undefined4 *)&pvVar3->field_0x4 = uVar2;
    pvVar3->val = aVar1;
    p = op_overload(this,(int)p - (int)entry_ptr_native_,lclidx,lclp,G_predef_X.operator_add,1,0x7d3
                   );
  }
  return p;
}

Assistant:

const uchar *CVmRun::compute_sum_lcl_imm(VMG_ vm_val_t *lclp,
                                         const vm_val_t *ival,
                                         int lclidx, const uchar *p)
{
    /* compute the sum, leaving the result in the local */
    if (compute_sum(vmg_ lclp, ival))
    {
        /* success */
        return p;
    }
    else
    {
        /* check for an overload */
        push(ival);
        return op_overload(vmg_ p - entry_ptr_native_, lclidx,
                           lclp, G_predef->operator_add, 1,
                           VMERR_BAD_TYPE_ADD);
    }
}